

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskIndex.cpp
# Opt level: O0

void __thiscall OnDiskIndex::prefetch(OnDiskIndex *this,TriGram trigram)

{
  undefined4 in_ESI;
  RawFile *in_RDI;
  uint64_t length;
  pair<unsigned_long,_unsigned_long> offsets;
  size_t in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffe0 [16];
  undefined4 in_stack_fffffffffffffff0;
  
  get_run_offsets((OnDiskIndex *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                  in_stack_ffffffffffffffe0._12_4_);
  RawFile::prefetch(in_RDI,in_stack_ffffffffffffffc8,0x19ec61);
  return;
}

Assistant:

void OnDiskIndex::prefetch(TriGram trigram) const {
    std::pair<uint64_t, uint64_t> offsets = get_run_offsets(trigram);
    uint64_t length = offsets.second - offsets.first;
    ndxfile.prefetch(length, offsets.first);
}